

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.cc
# Opt level: O1

StatusOr<security::pawn::Pci> security::pawn::Pci::Create(void)

{
  Status SVar1;
  int iVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  undefined8 extraout_RDX_02;
  anon_union_8_1_1246618d_for_StatusOrData<security::pawn::Pci>_1 in_RDI;
  string_view message;
  StatusOr<security::pawn::Pci> SVar4;
  Pci local_19;
  Status local_18;
  
  iVar2 = iopl(3);
  if (iVar2 == 0) {
    local_19.iopl_done_ = true;
    Pci((Pci *)((long)in_RDI + 8),&local_19);
    *(uintptr_t *)in_RDI = 1;
    ~Pci(&local_19);
    uVar3 = extraout_RDX_01;
  }
  else {
    message._M_str = (char *)0x5f;
    message._M_len = (size_t)&local_18;
    absl::FailedPreconditionError(message);
    SVar1.rep_ = local_18.rep_;
    *(uintptr_t *)in_RDI = local_18.rep_;
    local_18.rep_ = 0x37;
    uVar3 = extraout_RDX;
    if (SVar1.rep_ == 1) {
      absl::internal_statusor::Helper::HandleInvalidStatusCtorArg((Nonnull<absl::Status_*>)in_RDI);
      uVar3 = extraout_RDX_02;
    }
    if ((local_18.rep_ & 1) == 0) {
      absl::status_internal::StatusRep::Unref((StatusRep *)local_18.rep_);
      uVar3 = extraout_RDX_00;
    }
  }
  SVar4.super_StatusOrData<security::pawn::Pci>._8_8_ = uVar3;
  SVar4.super_StatusOrData<security::pawn::Pci>.field_0 = in_RDI;
  return (StatusOr<security::pawn::Pci>)SVar4.super_StatusOrData<security::pawn::Pci>;
}

Assistant:

absl::StatusOr<Pci> Pci::Create() {
  // Note: This will not work on Windows, since there is no official API that
  //       allows to do this. A small kernel driver is needed there.
  if (iopl(3 /* Request ring 3 access to all I/O ports. */) !=
      0 /* Success */) {
    return absl::FailedPreconditionError(
        "Failed to acquire I/O privileges. Make sure this "
        "process runs as root and/or has CAP_SYS_RAWIO.");
  }

  Pci pci;
  pci.iopl_done_ = true;
  return std::move(pci);  // GCC 7 needs the extra move
}